

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ImportModuleTypes(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  SmallArray<TypeBase_*,_32U> *this;
  ModuleData **ppMVar1;
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this_00;
  uint alignment;
  uint uniqueId;
  ByteCode *code;
  ModuleData *pMVar2;
  NamespaceData **ppNVar3;
  Lexeme *pLVar4;
  Allocator *allocator;
  ScopeData *scope;
  _func_int **pp_Var5;
  IntrusiveList<MatchData> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  DelayedType *pDVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  ExternTypeInfo *pEVar12;
  ModuleData **ppMVar13;
  size_t sVar14;
  TypeBase **ppTVar15;
  SynIdentifier *pSVar16;
  TypeHandle *pTVar17;
  MatchData *pMVar18;
  TypeClass *baseClass;
  SynBase *this_01;
  ParseContext *this_02;
  SynClassDefinition *definition;
  undefined4 extraout_var_04;
  TypeGenericClassProto *proto;
  TypeClass *this_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TypeBase *pTVar19;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  MemberHandle *pMVar21;
  size_t sVar22;
  undefined4 extraout_var_11;
  TypeBase *pTVar23;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ulong uVar24;
  undefined4 extraout_var_14;
  ExprBase *pEVar25;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  ConstantData *node;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ExternTypeInfo *pEVar29;
  TypeRef *__s;
  NamespaceData *nameSpace;
  ExternTypedefInfo *pEVar30;
  char *pcVar31;
  ulong uVar32;
  longlong *plVar33;
  char *pcVar34;
  byte bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  InplaceStr typeName;
  TypeClass *forwardDeclaration;
  IntrusiveList<TypeHandle> generics;
  IntrusiveList<MatchData> aliases;
  IntrusiveList<MatchData> actualGenerics;
  TraceScope traceScope;
  SmallArray<DelayedType,_32U> delayedTypes;
  ExternConstantInfo *local_3a0;
  InplaceStr local_348;
  ModuleContext *local_330;
  TypeClass *local_328;
  ExternTypeInfo *local_320;
  ExternTypedefInfo *local_318;
  TypeClass *local_310;
  IntrusiveList<TypeHandle> local_308;
  ExternMemberInfo *local_2f0;
  undefined1 local_2e8 [8];
  MatchData *pMStack_2e0;
  ModuleData *local_2d8;
  ModuleData *pMStack_2d0;
  char *pcStack_2c8;
  undefined2 local_2c0;
  undefined6 uStack_2be;
  undefined2 uStack_2b8;
  undefined6 uStack_2b6;
  undefined2 local_2b0;
  char *local_2a8;
  char *pcStack_2a0;
  TypeModulePair local_298;
  HashMap<TypeClass_*> *local_280;
  IntrusiveList<MatchData> local_278;
  TraceScope local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  SmallArray<DelayedType,_32U> local_248;
  undefined8 *puVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_10;
  undefined4 extraout_var_15;
  undefined4 extraout_var_18;
  
  local_330 = moduleCtx;
  if ((ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::
                                   token), iVar8 != 0)) {
    ImportModuleTypes::token = NULLC::TraceGetToken("analyze","ImportModuleTypes");
    __cxa_guard_release(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token);
    moduleCtx = local_330;
  }
  NULLC::TraceScope::TraceScope(&local_268,ImportModuleTypes::token);
  code = moduleCtx->data->bytecode;
  pcVar11 = FindSymbols(code);
  pEVar12 = FindFirstType(code);
  local_2f0 = FindFirstMember(code);
  local_3a0 = FindFirstConstant(code);
  local_318 = FindFirstTypedef(code);
  this = &moduleCtx->types;
  uVar26 = (moduleCtx->types).count;
  uVar10 = code->typeCount;
  if ((moduleCtx->types).max <= uVar10) {
    SmallArray<TypeBase_*,_32U>::grow(this,uVar10);
  }
  ppMVar1 = &moduleCtx->data;
  (moduleCtx->types).count = uVar10;
  memset((moduleCtx->types).data + uVar26,0,(ulong)(uVar10 - uVar26) << 3);
  local_248.allocator = ctx->allocator;
  lVar27 = 0x18;
  do {
    *(undefined4 *)((long)&uStack_250 + lVar27) = 0;
    *(undefined8 *)((long)&((SmallArray<DelayedType,_32U> *)(local_248.little + -1))->data + lVar27)
         = 0;
    lVar27 = lVar27 + 0x10;
  } while (lVar27 != 0x218);
  local_248.data = local_248.little;
  local_248.count = 0;
  local_248.max = 0x20;
  if (code->typeCount != 0) {
    this_00 = &ctx->internalTypeMap;
    local_280 = &ctx->genericTypeMap;
    uVar28 = 0;
    local_320 = pEVar12;
    do {
      ppMVar13 = ppMVar1;
      if (pEVar12[uVar28].definitionModule != 0) {
        uVar26 = pEVar12[uVar28].definitionModule - 1;
        if ((moduleCtx->dependencies).count <= uVar26) {
          pcVar11 = 
          "T &SmallArray<ModuleData *, 32>::operator[](unsigned int) [T = ModuleData *, N = 32]";
          goto LAB_00200712;
        }
        ppMVar13 = (moduleCtx->dependencies).data + uVar26;
      }
      pEVar29 = pEVar12 + uVar28;
      pMVar2 = *ppMVar13;
      if ((pEVar29->typeFlags & 8) == 0) {
LAB_001ff4b5:
        if (CAT_FUNCTION < pEVar29->subCat) {
          if (pEVar29->subCat != CAT_CLASS) {
            pcVar31 = ((*ppMVar1)->name).begin;
            anon_unknown.dwarf_1117a3::Stop
                      (ctx,source,"ERROR: new type in module %.*s named %s unsupported",
                       (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)pcVar31),pcVar31,
                       pcVar11 + pEVar29->offsetToName);
          }
          local_328 = (TypeClass *)0x0;
          pTVar19 = CheckPreviousTypeDefinition(ctx,source,moduleCtx,pcVar11,pEVar29,&local_328);
          if (pTVar19 == (TypeBase *)0x0) {
            pcVar31 = pcVar11 + pEVar29->offsetToName;
            local_348.begin = pcVar31;
            sVar14 = strlen(pcVar31);
            local_348.end = pcVar31 + sVar14;
            uVar24 = (ulong)(ctx->namespaces).count;
            if (uVar24 == 0) {
              bVar36 = false;
            }
            else {
              ppNVar3 = (ctx->namespaces).data;
              nameSpace = *ppNVar3;
              bVar36 = true;
              if (nameSpace->fullNameHash != pEVar29->namespaceHash) {
                uVar32 = 0;
                do {
                  if (uVar24 - 1 == uVar32) {
                    bVar36 = false;
                    goto LAB_001ff5e5;
                  }
                  nameSpace = ppNVar3[uVar32 + 1];
                  uVar32 = uVar32 + 1;
                } while (nameSpace->fullNameHash != pEVar29->namespaceHash);
                bVar36 = uVar32 < uVar24;
              }
              ExpressionContext::PushScope(ctx,nameSpace);
            }
LAB_001ff5e5:
            local_308.head = (TypeHandle *)0x0;
            local_308.tail = (TypeHandle *)0x0;
            local_278.head = (MatchData *)0x0;
            local_278.tail = (MatchData *)0x0;
            uVar26 = code->typedefCount;
            if (uVar26 == 0) {
              bVar35 = 0;
            }
            else {
              uVar24 = 0;
              bVar35 = 0;
              pEVar30 = local_318;
              do {
                if (uVar28 == pEVar30[uVar24].parentType) {
                  uVar10 = 0;
                  for (pTVar17 = local_308.head; pTVar17 != (TypeHandle *)0x0;
                      pTVar17 = pTVar17->next) {
                    uVar10 = uVar10 + 1;
                  }
                  if (uVar10 < pEVar29->genericTypeCount) {
                    pEVar30 = pEVar30 + uVar24;
                    pcVar31 = pcVar11 + pEVar30->offsetToName;
                    sVar14 = strlen(pcVar31);
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                    moduleCtx = local_330;
                    pSVar16 = (SynIdentifier *)CONCAT44(extraout_var,iVar8);
                    (pSVar16->super_SynBase).typeID = 4;
                    (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
                    (pSVar16->super_SynBase).end = (Lexeme *)0x0;
                    (pSVar16->super_SynBase).pos.begin = (char *)0x0;
                    (pSVar16->super_SynBase).pos.end = (char *)0x0;
                    *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
                    *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
                    (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
                    (pSVar16->name).begin = pcVar31;
                    (pSVar16->name).end = pcVar31 + sVar14;
                    pTVar19 = GetImportedModuleTypeAt(ctx,source,local_330,pEVar30->targetType);
                    if (pTVar19 == (TypeBase *)0x0) {
                      iVar8 = (int)((*ppMVar1)->name).begin;
                      anon_unknown.dwarf_1117a3::Stop
                                (ctx,source,
                                 "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                                 ,(ulong)(uint)((int)local_348.end - (int)local_348.begin),
                                 local_348.begin,pcVar11 + pEVar30->offsetToName,
                                 *(int *)&((*ppMVar1)->name).end - iVar8,iVar8);
                    }
                    bVar35 = bVar35 | pTVar19->isGeneric;
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                    pTVar17 = (TypeHandle *)CONCAT44(extraout_var_00,iVar8);
                    pTVar17->type = pTVar19;
                    pTVar17->next = (TypeHandle *)0x0;
                    pTVar17->listed = false;
                    IntrusiveList<TypeHandle>::push_back(&local_308,pTVar17);
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                    pMVar18 = (MatchData *)CONCAT44(extraout_var_01,iVar8);
                    pMVar18->name = pSVar16;
                    pMVar18->type = pTVar19;
                    pMVar18->next = (MatchData *)0x0;
                    pMVar18->listed = false;
                    IntrusiveList<MatchData>::push_back(&local_278,pMVar18);
                    uVar26 = code->typedefCount;
                    pEVar30 = local_318;
                  }
                }
                uVar24 = uVar24 + 1;
                pEVar12 = local_320;
              } while (uVar24 < uVar26);
            }
            if (pEVar29->baseType == 0) {
              baseClass = (TypeClass *)0x0;
            }
            else {
              baseClass = (TypeClass *)
                          GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar29->baseType);
              if ((baseClass == (TypeClass *)0x0) ||
                 ((baseClass->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                iVar8 = (int)((*ppMVar1)->name).begin;
                anon_unknown.dwarf_1117a3::Stop
                          (ctx,source,"ERROR: can\'t find type \'%.*s\' base type in module %.*s",
                           (ulong)(uint)((int)local_348.end - (int)local_348.begin),local_348.begin,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
              }
            }
            uVar26 = pMVar2->lexStreamSize;
            if (uVar26 <= pEVar29->definitionLocationStart) {
              __assert_fail("type.definitionLocationStart < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30ef,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            if (uVar26 <= pEVar29->definitionLocationEnd) {
              __assert_fail("type.definitionLocationEnd < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30f0,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            this_01 = source;
            if (pEVar29->definitionLocationEnd != 0 || pEVar29->definitionLocationStart != 0) {
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              this_01 = (SynBase *)CONCAT44(extraout_var_02,iVar8);
              SynBase::SynBase(this_01,1,pMVar2->lexStream + pEVar29->definitionLocationStart,
                               pMVar2->lexStream + pEVar29->definitionLocationEnd);
              this_01->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7190;
              uVar26 = pMVar2->lexStreamSize;
            }
            uVar10 = pEVar29->definitionLocationName;
            if (uVar26 <= uVar10) {
              __assert_fail("type.definitionLocationName < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30f4,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            if ((ulong)uVar10 == 0) {
              pcStack_2c8 = (char *)0x0;
              local_2c0 = 0;
              uStack_2be = 0;
              pMStack_2d0 = (ModuleData *)0x0;
            }
            else {
              pMStack_2d0 = (ModuleData *)(pMVar2->lexStream + uVar10);
              if (pMVar2->lexStream == (Lexeme *)0x0) {
                pcVar31 = (char *)0x0;
                pcStack_2c8 = (char *)0x0;
              }
              else {
                pcStack_2c8 = (pMStack_2d0->name).begin;
                pcVar31 = pcStack_2c8 + *(uint *)&(pMStack_2d0->name).end;
              }
              local_2c0 = SUB82(pcVar31,0);
              uStack_2be = (undefined6)((ulong)pcVar31 >> 0x10);
            }
            local_2b0._0_1_ = false;
            local_2b0._1_1_ = false;
            uStack_2b6 = 0;
            uStack_2b8 = 0;
            pMStack_2e0 = (MatchData *)CONCAT44(pMStack_2e0._4_4_,4);
            local_2e8 = (undefined1  [8])&PTR__SynBase_003e6190;
            local_2a8 = local_348.begin;
            pcStack_2a0 = local_348.end;
            local_2d8 = pMStack_2d0;
            if ((int)pEVar29->definitionOffset < -1) {
              if (local_328 != (TypeClass *)0x0) {
                __assert_fail("!forwardDeclaration",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x30fe,
                              "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                             );
              }
              proto = (TypeGenericClassProto *)
                      GetImportedModuleTypeAt
                                (ctx,source,moduleCtx,pEVar29->definitionOffset & 0x7fffffff);
              if (proto == (TypeGenericClassProto *)0x0) {
                anon_unknown.dwarf_1117a3::Stop
                          (ctx,source,"ERROR: can\'t find proto type for \'%s\' in module %.*s",
                           pcVar11 + pEVar29->offsetToName,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end -
                                        (int)((*ppMVar1)->name).begin));
              }
              if ((proto->super_TypeBase).typeID != 0x16) {
                anon_unknown.dwarf_1117a3::Stop
                          (ctx,source,
                           "ERROR: can\'t find correct proto type for \'%s\' in module %.*s",
                           pcVar11 + pEVar29->offsetToName,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end -
                                        (int)((*ppMVar1)->name).begin));
              }
              if ((bVar35 & 1) == 0) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
                this_03 = (TypeClass *)CONCAT44(extraout_var_05,iVar8);
                generics_00.tail._0_4_ = (int)local_278.tail;
                generics_00.head = local_278.head;
                generics_00.tail._4_4_ = (int)((ulong)local_278.tail >> 0x20);
                TypeClass::TypeClass
                          (this_03,ctx->allocator,(SynIdentifier *)local_2e8,this_01,ctx->scope,
                           proto,generics_00,(bool)((pEVar29->typeFlags & 4) >> 2),baseClass);
                bVar35 = pEVar29->typeFlags;
                if ((bVar35 & 0x10) != 0) {
                  this_03->completed = true;
                }
                if ((bVar35 & 8) != 0) {
                  this_03->isInternal = true;
                  local_298.typeName.begin = local_348.begin;
                  local_298.typeName.end = local_348.end;
                  local_310 = this_03;
                  local_298.importModule = pMVar2;
                  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                            (this_00,&local_298,(TypeBase **)&local_310);
                }
                ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                uVar26 = pEVar29->genericTypeCount;
                pTVar17 = local_308.head;
                if (local_308.head == (TypeHandle *)0x0) {
                  if (uVar26 != 0) goto LAB_002009c8;
                }
                else {
                  do {
                    pTVar17 = pTVar17->next;
                    uVar26 = uVar26 - 1;
                  } while (pTVar17 != (TypeHandle *)0x0);
                  if (uVar26 != 0) {
LAB_002009c8:
                    __assert_fail("type.genericTypeCount == generics.size()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                  ,0x3122,
                                  "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                                 );
                  }
                  uVar26 = NULLC::GetStringHash(local_348.begin,local_348.end);
                  HashMap<TypeClass_*>::insert(local_280,uVar26,this_03);
                }
              }
              else {
                generics_01.tail = local_308.tail;
                generics_01.head = local_308.head;
                this_03 = (TypeClass *)
                          ExpressionContext::GetGenericClassType(ctx,source,proto,generics_01);
              }
            }
            else {
              uVar26 = pEVar29->definitionOffsetStart;
              if ((ulong)uVar26 == 0xffffffff) {
                if (pEVar29->type == TYPE_COMPLEX) {
                  if (local_328 == (TypeClass *)0x0) {
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
                    this_03 = (TypeClass *)CONCAT44(extraout_var_07,iVar8);
                    local_258 = 0;
                    uStack_250 = 0;
                    TypeClass::TypeClass
                              (this_03,ctx->allocator,(SynIdentifier *)local_2e8,this_01,ctx->scope,
                               (TypeGenericClassProto *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),
                               (bool)((pEVar29->typeFlags & 4) >> 2),baseClass);
                    bVar35 = pEVar29->typeFlags;
                  }
                  else {
                    local_328->source = this_01;
                    (local_328->identifier).super_SynBase.listed = false;
                    (local_328->identifier).super_SynBase.isInternal = false;
                    (local_328->identifier).super_SynBase.pos.end =
                         (char *)CONCAT62(uStack_2be,local_2c0);
                    (local_328->identifier).super_SynBase.next = (SynBase *)0x0;
                    (local_328->identifier).super_SynBase.end = (Lexeme *)pMStack_2d0;
                    (local_328->identifier).super_SynBase.pos.begin = pcStack_2c8;
                    *(MatchData **)&(local_328->identifier).super_SynBase.typeID = pMStack_2e0;
                    (local_328->identifier).super_SynBase.begin = (Lexeme *)pMStack_2d0;
                    (local_328->identifier).name.begin = local_348.begin;
                    (local_328->identifier).name.end = local_348.end;
                    local_328->scope = ctx->scope;
                    bVar35 = pEVar29->typeFlags;
                    local_328->extendable = (bool)(bVar35 >> 2 & 1);
                    local_328->baseClass = baseClass;
                    this_03 = local_328;
                  }
                  if ((bVar35 & 0x10) != 0) {
                    this_03->completed = true;
                  }
                  if ((bVar35 & 8) != 0) {
                    this_03->isInternal = true;
                    local_298.typeName.begin = local_348.begin;
                    local_298.typeName.end = local_348.end;
                    local_310 = this_03;
                    local_298.importModule = pMVar2;
                    SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                              (this_00,&local_298,(TypeBase **)&local_310);
                  }
                  if (local_328 == (TypeClass *)0x0) {
                    ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                  }
                }
                else {
                  if (local_328 != (TypeClass *)0x0) {
                    __assert_fail("!forwardDeclaration",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                  ,0x3144,
                                  "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                                 );
                  }
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xe8);
                  this_03 = (TypeClass *)CONCAT44(extraout_var_06,iVar8);
                  TypeEnum::TypeEnum((TypeEnum *)this_03,(SynIdentifier *)local_2e8,this_01,
                                     ctx->scope);
                  ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                  if (local_308.head != (TypeHandle *)0x0) {
                    __assert_fail("generics.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                  ,0x314c,
                                  "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                                 );
                  }
                }
              }
              else {
                if (local_328 != (TypeClass *)0x0) {
                  __assert_fail("!forwardDeclaration",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x312a,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                if (pMVar2->lexStreamSize <= uVar26) {
                  __assert_fail("type.definitionOffsetStart < importModule->lexStreamSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x312c,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                pLVar4 = pMVar2->lexStream;
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x1640);
                this_02 = (ParseContext *)CONCAT44(extraout_var_03,iVar8);
                ParseContext::ParseContext
                          (this_02,ctx->allocator,ctx->optimizationLevel,
                           (ArrayView<InplaceStr>)ZEXT816(0));
                this_02->currentLexeme = pLVar4 + uVar26;
                ImportModuleNamespaces(this_02,pLVar4 + uVar26,pMVar2->bytecode);
                definition = (SynClassDefinition *)ParseClassDefinition(this_02);
                if ((definition == (SynClassDefinition *)0x0) ||
                   ((definition->super_SynBase).typeID != 0x3f)) {
                  anon_unknown.dwarf_1117a3::Stop
                            (ctx,source,"ERROR: failed to import generic class body");
                }
                (definition->super_SynBase).field_0x3a = 1;
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
                this_03 = (TypeClass *)CONCAT44(extraout_var_04,iVar8);
                TypeGenericClassProto::TypeGenericClassProto
                          ((TypeGenericClassProto *)this_03,(SynIdentifier *)local_2e8,this_01,
                           ctx->scope,definition);
                ExpressionContext::AddType(ctx,(TypeBase *)this_03);
              }
            }
            if (uVar28 < (moduleCtx->types).count) {
              this->data[uVar28] = (TypeBase *)this_03;
              ppTVar15 = this->data;
              ppTVar15[uVar28]->importModule = pMVar2;
              bVar7 = InplaceStr::operator==(&ppTVar15[uVar28]->name,&local_348);
              if (!bVar7) {
                __assert_fail("moduleCtx.types[i]->name == typeName",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x3177,
                              "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                             );
              }
              (this_03->super_TypeStruct).super_TypeBase.alignment = (uint)pEVar29->defaultAlign;
              (this_03->super_TypeStruct).super_TypeBase.size = (ulong)pEVar29->size;
              (this_03->super_TypeStruct).super_TypeBase.hasPointers = pEVar29->pointerCount != 0;
              uVar26 = (this_03->super_TypeStruct).super_TypeBase.typeID;
              if ((uVar26 < 0x1a) && ((0x3130000U >> (uVar26 & 0x1f) & 1) != 0)) {
                if (local_248.count == local_248.max) {
                  SmallArray<DelayedType,_32U>::grow(&local_248,local_248.count);
                }
                if (local_248.data == (DelayedType *)0x0) {
                  __assert_fail("data",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                ,0x162,
                                "void SmallArray<DelayedType, 32>::push_back(const T &) [T = DelayedType, N = 32]"
                               );
                }
                uVar24 = local_248._8_8_ & 0xffffffff;
                local_248.count = local_248.count + 1;
                local_248.data[uVar24].index = (uint)uVar28;
                local_248.data[uVar24].constants = local_3a0;
                local_3a0 = local_3a0 + pEVar29->constantCount;
                uVar26 = (this_03->super_TypeStruct).super_TypeBase.typeID;
              }
              if (uVar26 == 0x18) {
                this_03->hasFinalizer = (bool)(pEVar29->typeFlags & 1);
              }
              if (bVar36) {
                ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE,true);
              }
              goto LAB_001ff531;
            }
          }
          else if (uVar28 < (moduleCtx->types).count) goto LAB_001ff50d;
LAB_002006fd:
          pcVar11 = 
          "T &SmallArray<TypeBase *, 32>::operator[](unsigned int) [T = TypeBase *, N = 32]";
LAB_00200712:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,pcVar11);
        }
      }
      else {
        __s = (TypeRef *)(pcVar11 + pEVar29->offsetToName);
        sVar14 = strlen((char *)__s);
        pMStack_2e0 = (MatchData *)((long)&(__s->super_TypeBase)._vptr_TypeBase + sVar14);
        local_2e8 = (undefined1  [8])__s;
        local_2d8 = pMVar2;
        ppTVar15 = SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
                             (this_00,(TypeModulePair *)local_2e8);
        if (ppTVar15 == (TypeBase **)0x0) goto LAB_001ff4b5;
        if ((moduleCtx->types).count <= uVar28) goto LAB_002006fd;
        pTVar19 = *ppTVar15;
LAB_001ff50d:
        this->data[uVar28] = pTVar19;
        local_3a0 = local_3a0 + pEVar29->constantCount;
      }
LAB_001ff531:
      uVar28 = uVar28 + 1;
    } while (uVar28 < code->typeCount);
    if (local_248.count != 0) {
      uVar28 = 0;
      do {
        pDVar6 = local_248.data;
        uVar26 = local_248.data[uVar28].index;
        if (pEVar12[uVar26].subCat == CAT_CLASS) {
          pEVar29 = pEVar12 + uVar26;
          pcVar31 = pcVar11 + pEVar29->offsetToName;
          sVar14 = strlen(pcVar31);
          pTVar19 = GetImportedModuleTypeAt(ctx,source,moduleCtx,uVar26);
          if (pTVar19 != (TypeBase *)0x0) {
            uVar26 = pTVar19->typeID;
            if ((uVar26 < 0x1a) && ((0x3130000U >> (uVar26 & 0x1f) & 1) != 0)) {
              ExpressionContext::PushScope(ctx,pTVar19);
              pTVar19[1]._vptr_TypeBase = (_func_int **)ctx->scope;
              if ((pTVar19->typeID == 0x18) && (*(char *)&pTVar19[2].arrayTypes.tail == '\x01')) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
                allocator = ctx->allocator;
                scope = ctx->scope;
                pTVar23 = ctx->typeTypeID;
                iVar9 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
                puVar20 = (undefined8 *)CONCAT44(extraout_var_09,iVar9);
                *(undefined4 *)(puVar20 + 1) = 4;
                puVar20[2] = 0;
                puVar20[3] = 0;
                puVar20[4] = 0;
                puVar20[5] = 0;
                *(undefined8 *)((long)puVar20 + 0x2a) = 0;
                *(undefined8 *)((long)puVar20 + 0x32) = 0;
                *puVar20 = &PTR__SynBase_003e6190;
                puVar20[8] = "$typeid";
                puVar20[9] = "";
                uVar26 = ctx->uniqueVariableId;
                ctx->uniqueVariableId = uVar26 + 1;
                VariableData::VariableData
                          ((VariableData *)CONCAT44(extraout_var_08,iVar8),allocator,source,scope,0,
                           pTVar23,(SynIdentifier *)CONCAT44(extraout_var_09,iVar9),0,uVar26);
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
                pMVar21 = (MemberHandle *)CONCAT44(extraout_var_10,iVar9);
                pMVar21->source = source;
                pMVar21->variable = (VariableData *)CONCAT44(extraout_var_08,iVar8);
                pMVar21->initializer = (SynBase *)0x0;
                pMVar21->next = (MemberHandle *)0x0;
                pMVar21->listed = false;
                IntrusiveList<MemberHandle>::push_back
                          ((IntrusiveList<MemberHandle> *)&pTVar19[1].typeID,pMVar21);
              }
              pcVar34 = pcVar31 + sVar14 + 1;
              if ((pEVar29->field_8).arrSize != 0) {
                uVar26 = 0;
                do {
                  sVar22 = strlen(pcVar34);
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                  puVar20 = (undefined8 *)CONCAT44(extraout_var_11,iVar8);
                  *(undefined4 *)(puVar20 + 1) = 4;
                  puVar20[2] = 0;
                  puVar20[3] = 0;
                  puVar20[4] = 0;
                  puVar20[5] = 0;
                  *(undefined8 *)((long)puVar20 + 0x2a) = 0;
                  *(undefined8 *)((long)puVar20 + 0x32) = 0;
                  *puVar20 = &PTR__SynBase_003e6190;
                  puVar20[8] = pcVar34;
                  puVar20[9] = pcVar34 + sVar22;
                  uVar10 = (pEVar29->field_11).subType + uVar26;
                  pTVar23 = GetImportedModuleTypeAt(ctx,source,moduleCtx,local_2f0[uVar10].type);
                  if (pTVar23 == (TypeBase *)0x0) {
                    iVar8 = (int)((*ppMVar1)->name).begin;
                    anon_unknown.dwarf_1117a3::Stop
                              (ctx,source,
                               "ERROR: can\'t find member %d type for \'%s\' in module %.*s",
                               (ulong)(uVar26 + 1),pcVar11 + pEVar29->offsetToName,
                               (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
                  }
                  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
                  alignment = local_2f0[uVar10].alignment;
                  uVar10 = local_2f0[uVar10].offset;
                  uniqueId = ctx->uniqueVariableId;
                  ctx->uniqueVariableId = uniqueId + 1;
                  VariableData::VariableData
                            ((VariableData *)CONCAT44(extraout_var_12,iVar9),ctx->allocator,source,
                             ctx->scope,alignment,pTVar23,
                             (SynIdentifier *)CONCAT44(extraout_var_11,iVar8),uVar10,uniqueId);
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
                  pMVar21 = (MemberHandle *)CONCAT44(extraout_var_13,iVar8);
                  pMVar21->source = source;
                  pMVar21->variable = (VariableData *)CONCAT44(extraout_var_12,iVar9);
                  pMVar21->initializer = (SynBase *)0x0;
                  pMVar21->next = (MemberHandle *)0x0;
                  pMVar21->listed = false;
                  IntrusiveList<MemberHandle>::push_back
                            ((IntrusiveList<MemberHandle> *)&pTVar19[1].typeID,pMVar21);
                  uVar26 = uVar26 + 1;
                  pcVar34 = pcVar34 + sVar22 + 1;
                  moduleCtx = local_330;
                } while (uVar26 < (pEVar29->field_8).arrSize);
              }
              if (pEVar29->constantCount != 0) {
                plVar33 = &(pDVar6[uVar28].constants)->value;
                uVar24 = 1;
                do {
                  sVar22 = strlen(pcVar34);
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                  pSVar16 = (SynIdentifier *)CONCAT44(extraout_var_14,iVar8);
                  (pSVar16->super_SynBase).typeID = 4;
                  (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
                  (pSVar16->super_SynBase).end = (Lexeme *)0x0;
                  (pSVar16->super_SynBase).pos.begin = (char *)0x0;
                  (pSVar16->super_SynBase).pos.end = (char *)0x0;
                  *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
                  *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
                  (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
                  (pSVar16->name).begin = pcVar34;
                  (pSVar16->name).end = pcVar34 + sVar22;
                  pTVar23 = GetImportedModuleTypeAt
                                      (ctx,source,moduleCtx,
                                       ((ExternConstantInfo *)((long)plVar33 + -4))->type);
                  if (pTVar23 == (TypeBase *)0x0) {
                    iVar8 = (int)((*ppMVar1)->name).begin;
                    anon_unknown.dwarf_1117a3::Stop
                              (ctx,source,
                               "ERROR: can\'t find constant %d type for \'%s\' in module %.*s",
                               uVar24,pcVar11 + pEVar29->offsetToName,
                               (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
                  }
                  if (pTVar23 == ctx->typeBool) {
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                    pEVar25 = (ExprBase *)CONCAT44(extraout_var_16,iVar8);
                    lVar27 = *plVar33;
                    pEVar25->typeID = 3;
                    pEVar25->source = source;
                    pEVar25->type = pTVar23;
                    pEVar25->next = (ExprBase *)0x0;
                    pEVar25->listed = false;
                    pEVar25->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6358;
                    pEVar25->field_0x29 = lVar27 != 0;
                  }
                  else {
                    iVar8 = (int)pTVar23;
                    iVar9 = (int)((ulong)pTVar23 >> 0x20);
                    auVar37._0_4_ =
                         -(uint)(*(int *)((long)&ctx->typeChar + 4) == iVar9 &&
                                *(int *)&ctx->typeChar == iVar8);
                    auVar37._4_4_ =
                         -(uint)(*(int *)&ctx->typeShort == iVar8 &&
                                *(int *)((long)&ctx->typeShort + 4) == iVar9);
                    auVar37._8_4_ =
                         -(uint)(*(int *)((long)&ctx->typeInt + 4) == iVar9 &&
                                *(int *)&ctx->typeInt == iVar8);
                    auVar37._12_4_ =
                         -(uint)(*(int *)&ctx->typeLong == iVar8 &&
                                *(int *)((long)&ctx->typeLong + 4) == iVar9);
                    iVar8 = movmskps(iVar8,auVar37);
                    if ((iVar8 == 0) && (pTVar23->typeID != 0x19)) {
                      if ((ctx->typeFloat != pTVar23) && (ctx->typeDouble != pTVar23)) {
                        anon_unknown.dwarf_1117a3::Stop
                                  (ctx,source,"ERROR: can\'t import constant %d of type \'%.*s\'",
                                   uVar24,(ulong)(uint)(*(int *)&(pTVar23->name).end -
                                                       (int)(pTVar23->name).begin));
                      }
                      pp_Var5 = (_func_int **)*plVar33;
                      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                      pEVar25 = (ExprBase *)CONCAT44(extraout_var_17,iVar8);
                      pEVar25->typeID = 7;
                      pEVar25->source = source;
                      pEVar25->type = pTVar23;
                      pEVar25->next = (ExprBase *)0x0;
                      pEVar25->listed = false;
                      pEVar25->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6400;
                      pEVar25[1]._vptr_ExprBase = pp_Var5;
                    }
                    else {
                      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                      pEVar25 = (ExprBase *)CONCAT44(extraout_var_15,iVar8);
                      pp_Var5 = (_func_int **)*plVar33;
                      pEVar25->typeID = 6;
                      pEVar25->source = source;
                      pEVar25->type = pTVar23;
                      pEVar25->next = (ExprBase *)0x0;
                      pEVar25->listed = false;
                      pEVar25->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
                      pEVar25[1]._vptr_ExprBase = pp_Var5;
                    }
                  }
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                  node = (ConstantData *)CONCAT44(extraout_var_18,iVar8);
                  pcVar34 = pcVar34 + sVar22 + 1;
                  node->name = pSVar16;
                  node->value = pEVar25;
                  node->next = (ConstantData *)0x0;
                  node->listed = false;
                  IntrusiveList<ConstantData>::push_back
                            ((IntrusiveList<ConstantData> *)&pTVar19[1].name.end,node);
                  uVar26 = (uint)uVar24;
                  uVar24 = (ulong)(uVar26 + 1);
                  plVar33 = (longlong *)((long)plVar33 + 0xc);
                  moduleCtx = local_330;
                } while (uVar26 < pEVar29->constantCount);
              }
              ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
              uVar26 = pTVar19->typeID;
              pEVar12 = local_320;
            }
            if (uVar26 == 0x18) {
              local_2e8 = (undefined1  [8])0x0;
              pMStack_2e0 = (MatchData *)0x0;
              if (code->typedefCount != 0) {
                uVar24 = 0;
                uVar26 = 0;
                pEVar30 = local_318;
                do {
                  if (pEVar30->parentType == pDVar6[uVar28].index) {
                    pcVar34 = pcVar11 + pEVar30->offsetToName;
                    sVar22 = strlen(pcVar34);
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                    moduleCtx = local_330;
                    pSVar16 = (SynIdentifier *)CONCAT44(extraout_var_19,iVar8);
                    (pSVar16->super_SynBase).typeID = 4;
                    (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
                    (pSVar16->super_SynBase).end = (Lexeme *)0x0;
                    (pSVar16->super_SynBase).pos.begin = (char *)0x0;
                    (pSVar16->super_SynBase).pos.end = (char *)0x0;
                    *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
                    *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
                    (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
                    (pSVar16->name).begin = pcVar34;
                    (pSVar16->name).end = pcVar34 + sVar22;
                    pTVar23 = GetImportedModuleTypeAt(ctx,source,local_330,pEVar30->targetType);
                    if (pTVar23 == (TypeBase *)0x0) {
                      iVar8 = (int)((*ppMVar1)->name).begin;
                      anon_unknown.dwarf_1117a3::Stop
                                (ctx,source,
                                 "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                                 ,sVar14,pcVar31,pcVar11 + pEVar30->offsetToName,
                                 *(int *)&((*ppMVar1)->name).end - iVar8,iVar8);
                    }
                    if (uVar26 < pEVar29->genericTypeCount) {
                      uVar26 = uVar26 + 1;
                    }
                    else {
                      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                      pMVar18 = (MatchData *)CONCAT44(extraout_var_20,iVar8);
                      pMVar18->name = pSVar16;
                      pMVar18->type = pTVar23;
                      pMVar18->next = (MatchData *)0x0;
                      pMVar18->listed = false;
                      IntrusiveList<MatchData>::push_back
                                ((IntrusiveList<MatchData> *)local_2e8,pMVar18);
                    }
                  }
                  uVar24 = uVar24 + 1;
                  pEVar30 = pEVar30 + 1;
                } while (uVar24 < code->typedefCount);
              }
              pTVar19[2].refType = (TypeRef *)local_2e8;
              pTVar19[2].arrayTypes.head = (TypeHandle *)pMStack_2e0;
              pEVar12 = local_320;
            }
          }
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < (local_248._8_8_ & 0xffffffff));
    }
  }
  SmallArray<DelayedType,_32U>::~SmallArray(&local_248);
  NULLC::TraceScope::~TraceScope(&local_268);
  return;
}

Assistant:

void ImportModuleTypes(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleTypes");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import types
	ExternTypeInfo *typeList = FindFirstType(bCode);
	ExternMemberInfo *memberList = FindFirstMember(bCode);
	ExternConstantInfo *constantList = FindFirstConstant(bCode);
	ExternTypedefInfo *aliasList = FindFirstTypedef(bCode);

	unsigned prevSize = moduleCtx.types.size();

	moduleCtx.types.resize(bCode->typeCount);

	memset(moduleCtx.types.data + prevSize, 0, (moduleCtx.types.size() - prevSize) * sizeof(moduleCtx.types.data[0]));

	SmallArray<DelayedType, 32> delayedTypes(ctx.allocator);

	ExternConstantInfo *currentConstant = constantList;

	for(unsigned i = 0; i < bCode->typeCount; i++)
	{
		ExternTypeInfo &type = typeList[i];

		ModuleData *importModule = moduleCtx.data;

		if(type.definitionModule != 0)
			importModule = moduleCtx.dependencies[type.definitionModule - 1];

		// Skip internal types if we already imported that module
		if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
		{
			InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

			if(TypeBase **prev = ctx.internalTypeMap.find(TypeModulePair(typeName, importModule)))
			{
				moduleCtx.types[i] = *prev;

				currentConstant += type.constantCount;
				continue;
			}
		}

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
		case ExternTypeInfo::CAT_ARRAY:
		case ExternTypeInfo::CAT_POINTER:
		case ExternTypeInfo::CAT_FUNCTION:
			break;
		case ExternTypeInfo::CAT_CLASS:
			{
				TypeClass *forwardDeclaration = NULL;

				// Skip existing types
				if(TypeBase *prevType = CheckPreviousTypeDefinition(ctx, source, moduleCtx, symbols, type, &forwardDeclaration))
				{
					moduleCtx.types[i] = prevType;

					currentConstant += type.constantCount;
					break;
				}

				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				NamespaceData *parentNamespace = NULL;

				for(unsigned k = 0; k < ctx.namespaces.size(); k++)
				{
					if(ctx.namespaces[k]->fullNameHash == type.namespaceHash)
					{
						parentNamespace = ctx.namespaces[k];
						break;
					}
				}

				if(parentNamespace)
					ctx.PushScope(parentNamespace);

				// Find all generics for this type
				bool isGeneric = false;

				IntrusiveList<TypeHandle> generics;
				IntrusiveList<MatchData> actualGenerics;

				for(unsigned k = 0; k < bCode->typedefCount; k++)
				{
					ExternTypedefInfo &alias = aliasList[k];

					if(alias.parentType == i && generics.size() < type.genericTypeCount)
					{
						InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

						SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

						TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

						if(!targetType)
							Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

						isGeneric |= targetType->isGeneric;

						generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(targetType));
						actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
					}
				}

				TypeClass *baseType = NULL;

				if(type.baseType)
				{
					baseType = getType<TypeClass>(GetImportedModuleTypeAt(ctx, source, moduleCtx, type.baseType));

					if(!baseType)
						Stop(ctx, source, "ERROR: can't find type '%.*s' base type in module %.*s", FMT_ISTR(typeName), FMT_ISTR(moduleCtx.data->name));
				}

				assert(type.definitionLocationStart < importModule->lexStreamSize);
				assert(type.definitionLocationEnd < importModule->lexStreamSize);
				
				SynBase *locationSource = type.definitionLocationStart != 0 || type.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(type.definitionLocationStart + importModule->lexStream, type.definitionLocationEnd + importModule->lexStream) : source;

				assert(type.definitionLocationName < importModule->lexStreamSize);

				Lexeme *locationName = type.definitionLocationName + importModule->lexStream;

				SynIdentifier identifier = type.definitionLocationName != 0 ? SynIdentifier(locationName, locationName, typeName) : SynIdentifier(typeName);

				TypeBase *importedType = NULL;

				if(type.definitionOffset != ~0u && type.definitionOffset & 0x80000000)
				{
					assert(!forwardDeclaration);

					TypeBase *proto = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.definitionOffset & ~0x80000000);

					if(!proto)
						Stop(ctx, source, "ERROR: can't find proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					TypeGenericClassProto *protoClass = getType<TypeGenericClassProto>(proto);

					if(!protoClass)
						Stop(ctx, source, "ERROR: can't find correct proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					if(isGeneric)
					{
						importedType = ctx.GetGenericClassType(source, protoClass, generics);

						// TODO: assert that alias list is empty and that correct number of generics was exported
					}
					else
					{
						TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, protoClass, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
							classType->completed = true;

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
						{
							classType->isInternal = true;

							ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
						}

						importedType = classType;

						ctx.AddType(importedType);

						assert(type.genericTypeCount == generics.size());

						if(!generics.empty())
							ctx.genericTypeMap.insert(typeName.hash(), classType);
					}
				}
				else if(type.definitionOffsetStart != ~0u)
				{
					assert(!forwardDeclaration);

					assert(type.definitionOffsetStart < importModule->lexStreamSize);
					Lexeme *start = type.definitionOffsetStart + importModule->lexStream;

					ParseContext *parser = new (ctx.get<ParseContext>()) ParseContext(ctx.allocator, ctx.optimizationLevel, ArrayView<InplaceStr>());

					parser->currentLexeme = start;

					ImportModuleNamespaces(*parser, start, importModule->bytecode);

					SynClassDefinition *definition = getType<SynClassDefinition>(ParseClassDefinition(*parser));

					if(!definition)
						Stop(ctx, source, "ERROR: failed to import generic class body");

					definition->imported = true;

					importedType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(identifier, locationSource, ctx.scope, definition);

					ctx.AddType(importedType);

					// TODO: check that type doesn't have generics or aliases
				}
				else if(type.type != ExternTypeInfo::TYPE_COMPLEX)
				{
					assert(!forwardDeclaration);

					TypeEnum *enumType = new (ctx.get<TypeEnum>()) TypeEnum(identifier, locationSource, ctx.scope);

					importedType = enumType;

					ctx.AddType(importedType);

					assert(generics.empty());
				}
				else
				{
					IntrusiveList<MatchData> actualGenerics;

					TypeClass *classType = NULL;

					if(forwardDeclaration)
					{
						classType = forwardDeclaration;

						classType->source = locationSource;
						classType->identifier = identifier;
						classType->scope = ctx.scope;
						classType->extendable = (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0;
						classType->baseClass = baseType;
					}
					else
					{
						classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, NULL, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);
					}

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
						classType->completed = true;

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
					{
						classType->isInternal = true;

						ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
					}

					importedType = classType;

					if(!forwardDeclaration)
						ctx.AddType(importedType);
				}

				moduleCtx.types[i] = importedType;

				moduleCtx.types[i]->importModule = importModule;

				assert(moduleCtx.types[i]->name == typeName);

				importedType->alignment = type.defaultAlign;
				importedType->size = type.size;

				importedType->hasPointers = type.pointerCount != 0;

				if(getType<TypeStruct>(importedType))
				{
					delayedTypes.push_back(DelayedType(i, currentConstant));

					currentConstant += type.constantCount;
				}

				if(TypeClass *classType = getType<TypeClass>(importedType))
					classType->hasFinalizer = type.typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER;

				if(parentNamespace)
					ctx.PopScope(SCOPE_NAMESPACE);
			}
			break;
		default:
			Stop(ctx, source, "ERROR: new type in module %.*s named %s unsupported", FMT_ISTR(moduleCtx.data->name), symbols + type.offsetToName);
		}
	}

	for(unsigned i = 0; i < delayedTypes.size(); i++)
	{
		DelayedType &delayedType = delayedTypes[i];
		ExternTypeInfo &type = typeList[delayedType.index];

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_CLASS:
			{
				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				TypeBase *importedType = GetImportedModuleTypeAt(ctx, source, moduleCtx, delayedType.index);

				const char *memberNames = typeName.end + 1;

				if(TypeStruct *structType = getType<TypeStruct>(importedType))
				{
					ctx.PushScope(importedType);

					structType->typeScope = ctx.scope;

					if(TypeClass *typeClass = getType<TypeClass>(structType))
					{
						if(typeClass->extendable)
						{
							// TODO: apart from LLVM failure, were there any issues with this member missing?
							VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeTypeID, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid")), 0, ctx.uniqueVariableId++);

							structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
						}
					}

					for(unsigned n = 0; n < type.memberCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						ExternMemberInfo &memberInfo = memberList[type.memberOffset + n];

						TypeBase *memberType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberInfo.type);

						if(!memberType)
							Stop(ctx, source, "ERROR: can't find member %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, memberInfo.alignment, memberType, memberNameIdentifier, memberInfo.offset, ctx.uniqueVariableId++);

						structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
					}

					ExternConstantInfo *constantInfo = delayedType.constants;

					for(unsigned int n = 0; n < type.constantCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						TypeBase *constantType = GetImportedModuleTypeAt(ctx, source, moduleCtx, constantInfo->type);

						if(!constantType)
							Stop(ctx, source, "ERROR: can't find constant %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						ExprBase *value = NULL;

						if(constantType == ctx.typeBool)
						{
							value = new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, constantType, constantInfo->value != 0);
						}
						else if(ctx.IsIntegerType(constantType) || isType<TypeEnum>(constantType))
						{
							value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, constantType, constantInfo->value);
						}
						else if(ctx.IsFloatingPointType(constantType))
						{
							double data = 0.0;
							memcpy(&data, &constantInfo->value, sizeof(double));
							value = new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, constantType, data);
						}
							
						if(!value)
							Stop(ctx, source, "ERROR: can't import constant %d of type '%.*s'", n + 1, FMT_ISTR(constantType->name));

						structType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(memberNameIdentifier, value));

						constantInfo++;
					}

					ctx.PopScope(SCOPE_TYPE);
				}

				if(TypeClass *typeClass = getType<TypeClass>(importedType))
				{
					unsigned genericsFound = 0;

					IntrusiveList<MatchData> aliases;

					for(unsigned k = 0; k < bCode->typedefCount; k++)
					{
						ExternTypedefInfo &alias = aliasList[k];

						if(alias.parentType == delayedType.index)
						{
							InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

							SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

							TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

							if(!targetType)
								Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

							if(genericsFound < type.genericTypeCount)
								genericsFound++;
							else
								aliases.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
						}
					}

					typeClass->aliases = aliases;
				}
			}
			break;
		default:
			break;
		}
	}
}